

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZHybridizeHDiv.cpp
# Opt level: O2

tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> * __thiscall
TPZHybridizeHDiv::Hybridize
          (tuple<TPZCompMesh_*,_TPZVec<TPZCompMesh_*>_> *__return_storage_ptr__,
          TPZHybridizeHDiv *this,TPZCompMesh *cmesh_HDiv,TPZVec<TPZCompMesh_*> *meshvec_HDiv,
          bool group_elements,double Lagrange_term_multiplier)

{
  TPZCompMesh *pTVar1;
  int i;
  long lVar2;
  TPZManVector<TPZCompMesh_*,_3> meshvec_Hybrid;
  TPZManVector<TPZCompMesh_*,_3> local_a8;
  _Tuple_impl<0UL,_TPZCompMesh_*,_TPZManVector<TPZCompMesh_*,_3>_> local_70;
  
  local_70.super__Tuple_impl<1UL,_TPZManVector<TPZCompMesh_*,_3>_>.
  super__Head_base<1UL,_TPZManVector<TPZCompMesh_*,_3>,_false>._M_head_impl.
  super_TPZVec<TPZCompMesh_*>._vptr_TPZVec = (_func_int **)0x0;
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            (&local_a8,meshvec_HDiv->fNElements,(TPZCompMesh **)&local_70);
  for (lVar2 = 0; lVar2 < meshvec_HDiv->fNElements; lVar2 = lVar2 + 1) {
    pTVar1 = TPZCompMesh::Clone(meshvec_HDiv->fStore[lVar2]);
    local_a8.super_TPZVec<TPZCompMesh_*>.fStore[lVar2] = pTVar1;
  }
  ComputePeriferalMaterialIds(this,&local_a8.super_TPZVec<TPZCompMesh_*>);
  ComputeNState(this,&local_a8.super_TPZVec<TPZCompMesh_*>);
  InsertPeriferalMaterialObjects(this,&local_a8.super_TPZVec<TPZCompMesh_*>);
  HybridizeInternalSides(this,&local_a8.super_TPZVec<TPZCompMesh_*>);
  pTVar1 = CreateMultiphysicsMesh
                     (this,cmesh_HDiv,&local_a8.super_TPZVec<TPZCompMesh_*>,Lagrange_term_multiplier
                     );
  CreateInterfaceElements(this,pTVar1,&local_a8.super_TPZVec<TPZCompMesh_*>);
  if (group_elements) {
    GroupandCondenseElements(pTVar1);
  }
  TPZManVector<TPZCompMesh_*,_3>::TPZManVector
            ((TPZManVector<TPZCompMesh_*,_3> *)&local_70,&local_a8);
  local_70.super__Head_base<0UL,_TPZCompMesh_*,_false>._M_head_impl = pTVar1;
  std::_Tuple_impl<0ul,TPZCompMesh*,TPZVec<TPZCompMesh*>>::
  _Tuple_impl<TPZCompMesh*,TPZManVector<TPZCompMesh*,3>>
            ((_Tuple_impl<0ul,TPZCompMesh*,TPZVec<TPZCompMesh*>> *)__return_storage_ptr__,&local_70)
  ;
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector((TPZManVector<TPZCompMesh_*,_3> *)&local_70);
  TPZManVector<TPZCompMesh_*,_3>::~TPZManVector(&local_a8);
  return __return_storage_ptr__;
}

Assistant:

std::tuple<TPZCompMesh*, TPZVec<TPZCompMesh*> > TPZHybridizeHDiv::Hybridize(TPZCompMesh* cmesh_HDiv, TPZVec<TPZCompMesh*>& meshvec_HDiv, bool group_elements, double Lagrange_term_multiplier /* = 1. */) {
    TPZManVector<TPZCompMesh *, 3> meshvec_Hybrid(meshvec_HDiv.size(), 0);
    for (int i = 0; i < meshvec_HDiv.size(); i++) {
        meshvec_Hybrid[i] = meshvec_HDiv[i]->Clone();
    }
    ComputePeriferalMaterialIds(meshvec_Hybrid);
    ComputeNState(meshvec_Hybrid);
    /// insert the material objects for HDivWrap and LagrangeInterface
    InsertPeriferalMaterialObjects(meshvec_Hybrid);
    HybridizeInternalSides(meshvec_Hybrid);
    TPZCompMesh *cmesh_Hybrid = CreateMultiphysicsMesh(cmesh_HDiv, meshvec_Hybrid, Lagrange_term_multiplier);
    CreateInterfaceElements(cmesh_Hybrid, meshvec_Hybrid);
    if (group_elements){
        GroupandCondenseElements(cmesh_Hybrid);
    }
    return std::make_tuple(cmesh_Hybrid, meshvec_Hybrid);
}